

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::WriteLengthDelimited
          (internal *this,uint32 num,StringPiece val,string *s)

{
  string *s_00;
  undefined4 in_register_00000034;
  
  s_00 = (string *)val.length_;
  WriteVarint((ulong)((int)this * 8 + 2),s_00);
  WriteVarint((uint64)val.ptr_,s_00);
  std::__cxx11::string::append((char *)s_00,CONCAT44(in_register_00000034,num));
  return;
}

Assistant:

void WriteLengthDelimited(uint32 num, StringPiece val, std::string* s) {
  WriteVarint((num << 3) + 2, s);
  WriteVarint(val.size(), s);
  s->append(val.data(), val.size());
}